

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_symbol_codec.cpp
# Opt level: O1

bool __thiscall
lzham::symbol_codec::encode(symbol_codec *this,uint sym,adaptive_arith_data_model *model)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  bool bVar4;
  
  uVar2 = 1;
  uVar3 = model->m_total_syms;
  do {
    bVar4 = (sym & uVar3 >> 1) != 0;
    bVar1 = encode(this,(uint)bVar4,(model->m_probs).m_p + uVar2,true);
    if (bVar1) {
      uVar2 = (ulong)((uint)bVar4 + (int)uVar2 * 2);
    }
  } while ((3 < uVar3) && (uVar3 = uVar3 >> 1, bVar1));
  return bVar1;
}

Assistant:

bool symbol_codec::encode(uint sym, adaptive_arith_data_model& model)
   {
      uint node = 1;

      uint bitmask = model.m_total_syms;

      do
      {
         bitmask >>= 1;

         uint bit = (sym & bitmask) ? 1 : 0;
         if (!encode(bit, model.m_probs[node]))
            return false;
         node = (node << 1) + bit;

      } while (bitmask > 1);
      return true;
   }